

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::CTransformFeedback::Cleanup(CTransformFeedback *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  if (this->_vao != 0) {
    glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->_vao);
  }
  if (this->_vbo != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_vbo);
  }
  if (this->_ebo != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_ebo);
  }
  if (this->_ubo != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_ubo);
  }
  if (this->_bufferIndirect != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferIndirect);
  }
  if (this->_program != 0) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->_program);
  }
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisableVertexAttribArray(0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		glBindVertexArray(0);
		glUseProgram(0);

		if (_vao)
		{
			glDeleteVertexArrays(1, &_vao);
		}
		if (_vbo)
		{
			glDeleteBuffers(1, &_vbo);
		}
		if (_ebo)
		{
			glDeleteBuffers(1, &_ebo);
		}
		if (_ubo)
		{
			glDeleteBuffers(1, &_ubo);
		}
		if (_bufferIndirect)
		{
			glDeleteBuffers(1, &_bufferIndirect);
		}
		if (_program)
		{
			glDeleteProgram(_program);
		}
		return NO_ERROR;
	}